

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

bool __thiscall Kernel::TermList::containsAllVariablesOf(TermList *this,TermList t)

{
  bool bVar1;
  int iVar2;
  TermList val;
  TermList val_00;
  TermIterator newVars;
  TermIterator oldVars;
  Set<Kernel::TermList,_Lib::DefaultHash> vars;
  undefined1 local_48 [8];
  undefined1 local_40 [48];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  Lib::Set<Kernel::TermList,_Lib::DefaultHash>::Set
            ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_40 + 8));
  Term::getVariableIterator((Term *)local_40,(TermList)this->_content);
  while( true ) {
    iVar2 = (*(*(_func_int ***)local_40._0_8_)[2])();
    if ((char)iVar2 == '\0') break;
    val._content._0_4_ = (*(*(_func_int ***)local_40._0_8_)[3])();
    val._content._4_4_ = extraout_var;
    Lib::Set<Kernel::TermList,_Lib::DefaultHash>::insert
              ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_40 + 8),val);
  }
  Term::getVariableIterator((Term *)local_48,t);
  do {
    iVar2 = (*(*(_func_int ***)local_48)[2])();
    if ((byte)iVar2 == 0) break;
    val_00._content._0_4_ = (*(*(_func_int ***)local_48)[3])();
    val_00._content._4_4_ = extraout_var_00;
    bVar1 = Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
                      ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_40 + 8),val_00);
  } while (bVar1);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator
            ((VirtualIterator<Kernel::TermList> *)local_48);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator
            ((VirtualIterator<Kernel::TermList> *)local_40);
  Lib::Set<Kernel::TermList,_Lib::DefaultHash>::~Set
            ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_40 + 8));
  return (bool)((byte)iVar2 ^ 1);
}

Assistant:

bool TermList::containsAllVariablesOf(TermList t) const
{
  Set<TermList> vars;
  TermIterator oldVars=Term::getVariableIterator(*this);
  while (oldVars.hasNext()) {
    vars.insert(oldVars.next());
  }
  TermIterator newVars=Term::getVariableIterator(t);
  while (newVars.hasNext()) {
    if (!vars.contains(newVars.next())) {
      return false;
    }
  }
  return true;
}